

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict
sexp_arithmetic_shift
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict i,sexp_conflict count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  int iVar6;
  sexp_conflict in_RCX;
  sexp_conflict in_RDX;
  sexp_conflict in_RSI;
  long in_RDI;
  sexp_conflict in_R8;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_sint_t j;
  sexp_sint_t tail_shift;
  sexp_sint_t bit_shift;
  sexp_sint_t offset;
  sexp_sint_t len;
  sexp_sint_t c;
  sexp_uint_t tmp;
  long local_88;
  sexp_conflict *local_80;
  undefined8 local_78;
  sexp_conflict local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  sexp_conflict in_stack_ffffffffffffffc8;
  long lVar7;
  ulong uVar8;
  sexp_conflict local_8;
  
  local_70 = (sexp_conflict)0x43e;
  memset(&local_80,0,0x10);
  if (((ulong)in_R8 & 1) == 1) {
    auVar1._8_8_ = (long)in_R8 >> 0x3f;
    auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
    local_40 = SUB168(auVar1 / SEXT816(2),0);
    local_8 = in_RCX;
    if (local_40 != 0) {
      if (((ulong)in_RCX & 1) == 1) {
        if ((long)local_40 < 0) {
          if (local_40 < 0xffffffffffffffc1) {
            local_88 = 0;
          }
          else {
            auVar2._8_8_ = (long)in_RCX >> 0x3f;
            auVar2._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
            local_88 = SUB168(auVar2 / SEXT816(2),0) >> (-SUB161(auVar1 / SEXT816(2),0) & 0x3fU);
          }
          local_70 = (sexp_conflict)(local_88 << 1 | 1);
        }
        else {
          auVar3._8_8_ = (long)in_RCX >> 0x3f;
          auVar3._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
          iVar6 = log2i(SUB168(auVar3 / SEXT816(2),0));
          if ((long)iVar6 + local_40 + 1 < 0x3f) {
            auVar4._8_8_ = (long)in_RCX >> 0x3f;
            auVar4._0_8_ = (ulong)in_RCX & 0xfffffffffffffffe;
            local_70 = (sexp_conflict)
                       ((SUB168(auVar4 / SEXT816(2),0) << ((byte)local_40 & 0x3f)) *
                        ((long)in_RCX >> 0x3f | 1U) * 2 | 1);
          }
          else {
            local_80 = &local_70;
            local_78 = *(undefined8 *)(in_RDI + 0x6080);
            *(sexp_conflict ***)(in_RDI + 0x6080) = &local_80;
            local_70 = (sexp_conflict)sexp_fixnum_to_bignum(in_RDI,in_RCX);
            local_70 = sexp_arithmetic_shift
                                 (in_RSI,in_RDX,(sexp_sint_t)in_RCX,in_R8,in_stack_ffffffffffffffc8)
            ;
            *(undefined8 *)(in_RDI + 0x6080) = local_78;
          }
        }
      }
      else if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0xc)) {
        local_48 = sexp_bignum_hi(in_RCX);
        if ((long)local_40 < 0) {
          local_40 = -local_40;
          local_50 = local_40 >> 6;
          local_58 = local_40 + local_50 * -0x40;
          if (local_48 < (long)local_50) {
            iVar6 = -1;
            if ('\0' < (in_RCX->value).flonum_bits[0]) {
              iVar6 = 0;
            }
            local_70 = (sexp_conflict)((long)iVar6 << 1 | 1);
          }
          else {
            local_70 = (sexp_conflict)sexp_make_bignum(in_RDI,(local_48 - local_50) + 1);
            if ((((ulong)local_70 & 3) != 0) || (local_70->tag != 0x13)) {
              (local_70->value).flonum_bits[0] = (in_RCX->value).flonum_bits[0];
              lVar7 = 0;
              local_68 = local_48 - local_50;
              while (lVar5 = local_68, local_68 = lVar5 + -1, -1 < local_68) {
                *(ulong *)((long)&local_70->value + lVar5 * 8 + 8) =
                     (*(ulong *)((long)&in_RCX->value + lVar5 * 8 + local_50 * 8 + 8) >>
                     ((byte)local_58 & 0x3f)) + lVar7;
                if (local_58 != 0) {
                  lVar7 = *(long *)((long)&in_RCX->value + lVar5 * 8 + local_50 * 8 + 8) <<
                          (0x40 - (byte)local_58 & 0x3f);
                }
              }
              if ((local_70->value).flonum_bits[0] < '\0') {
                local_70 = (sexp_conflict)sexp_bignum_fxadd(in_RDI,local_70,1);
              }
            }
          }
        }
        else {
          local_50 = local_40 >> 6;
          local_58 = local_40 + local_50 * -0x40;
          local_60 = 0x40 - local_58;
          local_70 = (sexp_conflict)sexp_make_bignum(in_RDI,local_48 + local_50 + 1);
          if ((((ulong)local_70 & 3) != 0) || (local_70->tag != 0x13)) {
            (local_70->value).flonum_bits[0] = (in_RCX->value).flonum_bits[0];
            uVar8 = 0;
            for (local_68 = 0; local_68 < local_48; local_68 = local_68 + 1) {
              *(ulong *)((long)&local_70->value + (local_68 + local_50) * 8 + 0x10) =
                   (*(long *)((long)&in_RCX->value + local_68 * 8 + 0x10) << ((byte)local_58 & 0x3f)
                   ) + uVar8;
              if (local_58 != 0) {
                uVar8 = *(ulong *)((long)&in_RCX->value + local_68 * 8 + 0x10) >>
                        ((byte)local_60 & 0x3f);
              }
            }
            if (local_58 != 0) {
              *(ulong *)((long)&local_70->value + (local_48 + local_50) * 8 + 0x10) = uVar8;
            }
          }
        }
      }
      else {
        local_70 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
      }
      local_8 = (sexp_conflict)sexp_bignum_normalize(local_70);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
  }
  return local_8;
}

Assistant:

sexp sexp_arithmetic_shift (sexp ctx, sexp self, sexp_sint_t n, sexp i, sexp count) {
  sexp_uint_t tmp;
  sexp_sint_t c;
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, offset, bit_shift, tail_shift, j;
  sexp_gc_var1(res);
#else
  sexp res;
#endif
  if (! sexp_fixnump(count))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, count);
  c = sexp_unbox_fixnum(count);
  if (c == 0) return i;
  if (sexp_fixnump(i)) {
    if (c < 0) {
      res = sexp_make_fixnum(c > -sizeof(sexp_sint_t)*CHAR_BIT ? sexp_unbox_fixnum(i) >> -c : 0);
    } else {
#if SEXP_USE_BIGNUMS
      if ((log2i(sexp_unbox_fixnum(i)) + c + 1)
          < (sizeof(sexp_uint_t)*CHAR_BIT - SEXP_FIXNUM_BITS)) {
#endif
        tmp = (sexp_uint_t)sexp_unbox_fixnum(i) << c;
        res = sexp_make_fixnum(tmp * sexp_fx_sign(i));
#if SEXP_USE_BIGNUMS
      } else {
        sexp_gc_preserve1(ctx, res);
        res = sexp_fixnum_to_bignum(ctx, i);
        res = sexp_arithmetic_shift(ctx, self, n, res, count);
        sexp_gc_release1(ctx);
      }
#endif
    }
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(i)) {
    len = sexp_bignum_hi(i);
    if (c < 0) {
      c = -c;
      offset = c / (sizeof(sexp_uint_t)*CHAR_BIT);
      bit_shift = c - offset*(sizeof(sexp_uint_t)*CHAR_BIT);
      if (len < offset) {
        res = sexp_make_fixnum(sexp_bignum_sign(i) > 0 ? 0 : -1);
      } else {
        res = sexp_make_bignum(ctx, len - offset + 1);
        if (!sexp_exceptionp(res)) {
          sexp_bignum_sign(res) = sexp_bignum_sign(i);
          for (j=len-offset-1, tmp=0; j>=0; j--) {
            sexp_bignum_data(res)[j]
              = (sexp_bignum_data(i)[j+offset] >> bit_shift)+ tmp;
            if (bit_shift != 0)
              tmp = sexp_bignum_data(i)[j+offset]
                << (sizeof(sexp_uint_t)*CHAR_BIT-bit_shift);
          }
          if (sexp_bignum_sign(res) < 0)
            res = sexp_bignum_fxadd(ctx, res, 1);
        }
      }
    } else {
      offset = c / (sizeof(sexp_uint_t)*CHAR_BIT);
      bit_shift = c - offset*(sizeof(sexp_uint_t)*CHAR_BIT);
      tail_shift = (sizeof(sexp_uint_t)*CHAR_BIT-bit_shift);
      res = sexp_make_bignum(ctx, len + offset + 1);
      if (!sexp_exceptionp(res)) {
        sexp_bignum_sign(res) = sexp_bignum_sign(i);
        for (j=tmp=0; j<len; j++) {
          sexp_bignum_data(res)[j+offset]
            = (sexp_bignum_data(i)[j] << bit_shift) + tmp;
          if (bit_shift != 0)
            tmp = sexp_bignum_data(i)[j] >> tail_shift;
        }
        if (bit_shift != 0) sexp_bignum_data(res)[len+offset] = tmp;
      }
    }
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, i);
  }
  return sexp_bignum_normalize(res);
}